

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStructSet(TranslateToFuzzReader *this,Type type)

{
  Type type_00;
  bool bVar1;
  value_type *pvVar2;
  type *ptVar3;
  type *ptVar4;
  vector<wasm::Field,_std::allocator<wasm::Field>_> *this_00;
  const_reference pvVar5;
  Expression *ref_00;
  Expression *value_00;
  Expression *value;
  Expression *ref;
  Type fieldType;
  type *fieldIndex;
  type *structType;
  undefined8 local_38;
  TranslateToFuzzReader *local_30;
  BasicType local_24;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_24 = none;
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = Type::operator==((Type *)&this_local,&local_24);
  if (!bVar1) {
    __assert_fail("type == Type::none",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1369,"Expression *wasm::TranslateToFuzzReader::makeStructSet(Type)");
  }
  bVar1 = std::
          vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
          ::empty(&this->mutableStructFields);
  if (bVar1) {
    local_30 = this_local;
    type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
  }
  else {
    pvVar2 = pick<std::vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
                       (this,&this->mutableStructFields);
    structType = (type *)(pvVar2->first).id;
    local_38._0_4_ = pvVar2->second;
    local_38._4_4_ = *(undefined4 *)&pvVar2->field_0xc;
    ptVar3 = std::get<0ul,wasm::HeapType,unsigned_int>
                       ((pair<wasm::HeapType,_unsigned_int> *)&structType);
    ptVar4 = std::get<1ul,wasm::HeapType,unsigned_int>
                       ((pair<wasm::HeapType,_unsigned_int> *)&structType);
    this_00 = (vector<wasm::Field,_std::allocator<wasm::Field>_> *)::wasm::HeapType::getStruct();
    pvVar5 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                       (this_00,(ulong)*ptVar4);
    type_00.id = (pvVar5->type).id;
    ref_00 = makeTrappingRefUse(this,(HeapType)ptVar3->id);
    value_00 = make(this,type_00);
    type_local.id =
         (uintptr_t)Builder::makeStructSet(&this->builder,*ptVar4,ref_00,value_00,Unordered);
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeStructSet(Type type) {
  assert(type == Type::none);
  if (mutableStructFields.empty()) {
    return makeTrivial(type);
  }
  auto [structType, fieldIndex] = pick(mutableStructFields);
  auto fieldType = structType.getStruct().fields[fieldIndex].type;
  auto* ref = makeTrappingRefUse(structType);
  auto* value = make(fieldType);
  return builder.makeStructSet(fieldIndex, ref, value, MemoryOrder::Unordered);
}